

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapelinear.cpp
# Opt level: O1

void pzshape::TPZShapeLinear::Hermite
               (REAL x,int num,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  ulong uVar1;
  double local_58;
  REAL local_50;
  double local_48;
  double local_40;
  ulong local_38;
  
  if (0 < num) {
    local_58 = 1.0;
    local_50 = x;
    (*(phi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x20])
              (phi,0,0,&local_58);
    local_58 = 0.0;
    (*(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x20])
              (dphi,0,0,&local_58);
    if (num != 1) {
      local_58 = local_50 + local_50;
      local_50 = local_58;
      (*(phi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x20])
                (phi,1,0,&local_58);
      local_58 = 2.0;
      (*(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x20])
                (dphi,0,1,&local_58);
      if (2 < num) {
        uVar1 = 2;
        local_38 = (ulong)(uint)num;
        do {
          if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < (long)uVar1) ||
             ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          local_40 = phi->fElem[uVar1 - 1];
          local_48 = (double)(int)uVar1 + (double)(int)uVar1 + -1.0;
          if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= (long)(uVar1 - 2)) ||
             ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          local_58 = local_40 * local_50 - phi->fElem[uVar1 - 2] * local_48;
          (*(phi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0x20])(phi,uVar1,0,&local_58);
          if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= (long)(uVar1 - 2)) ||
             ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          local_58 = local_48 * phi->fElem[uVar1 - 2];
          (*(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0x20])(dphi,0,uVar1,&local_58);
          uVar1 = uVar1 + 1;
        } while (uVar1 != local_38);
      }
    }
  }
  return;
}

Assistant:

void TPZShapeLinear::Hermite(REAL x,int num,TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi) {
		// Quadratic or higher shape functions (for physicists)
		if(num <= 0) return;
		phi.Put(0,0,1.0);
		dphi.Put(0,0, 0.0);
		if(num == 1) return;
		phi.Put(1,0, 2.0*x);
		dphi.Put(0,1, 2.0);
        // Following http://mathworld.wolfram.com/HermitePolynomial.html
		for(int ord = 2;ord<num;ord++) {
			phi.Put(ord,0, 2.0*x*phi(ord-1,0) - (2.0*(REAL)ord-1.0)*phi(ord-2,0));
			dphi.Put(0,ord, (2.0*(REAL)ord-1.0)*phi(ord-2,0));
		}
	}